

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ipcommunication.c
# Opt level: O3

int ipcmd_recv_tcp(ipcmd_t *ipcmd,YPSpur_msg *data)

{
  int iVar1;
  int iVar2;
  ipcmd_tcp_type_t iVar3;
  long lVar4;
  ssize_t sVar5;
  uint uVar6;
  ulong uVar7;
  char *pcVar8;
  int iVar9;
  uint __fd;
  ulong uVar10;
  uint addr_size;
  sockaddr_in client;
  fd_set fds;
  socklen_t local_cc;
  undefined1 local_c8 [16];
  fd_set local_b8;
  
  if (ipcmd == (ipcmd_t *)0x0) {
    return -1;
  }
  if (ipcmd->connection_error != 0) {
    return -1;
  }
  do {
    local_b8.fds_bits[0] = 0;
    local_b8.fds_bits[1] = 0;
    local_b8.fds_bits[2] = 0;
    local_b8.fds_bits[3] = 0;
    local_b8.fds_bits[4] = 0;
    local_b8.fds_bits[5] = 0;
    local_b8.fds_bits[6] = 0;
    local_b8.fds_bits[7] = 0;
    local_b8.fds_bits[8] = 0;
    local_b8.fds_bits[9] = 0;
    local_b8.fds_bits[10] = 0;
    local_b8.fds_bits[0xb] = 0;
    local_b8.fds_bits[0xc] = 0;
    local_b8.fds_bits[0xd] = 0;
    local_b8.fds_bits[0xe] = 0;
    local_b8.fds_bits[0xf] = 0;
    iVar2 = ipcmd->socket;
    iVar1 = iVar2 + 0x3f;
    if (-1 < iVar2) {
      iVar1 = iVar2;
    }
    iVar9 = 0;
    if (0 < iVar2) {
      iVar9 = iVar2;
    }
    local_b8.fds_bits[iVar1 >> 6] =
         local_b8.fds_bits[iVar1 >> 6] | 1L << ((byte)(iVar2 % 0x40) & 0x3f);
    lVar4 = 0;
    do {
      iVar2 = ipcmd->clients[lVar4];
      iVar1 = iVar9;
      if (iVar2 != -1) {
        iVar1 = iVar2 + 0x3f;
        if (-1 < iVar2) {
          iVar1 = iVar2;
        }
        local_b8.fds_bits[iVar1 >> 6] = local_b8.fds_bits[iVar1 >> 6] | 1L << ((byte)iVar2 & 0x3f);
        iVar1 = iVar2;
        if (iVar2 < iVar9) {
          iVar1 = iVar9;
        }
      }
      iVar9 = iVar1;
      lVar4 = lVar4 + 1;
    } while (lVar4 != 0x40);
    iVar2 = select(iVar9 + 1,&local_b8,(fd_set *)0x0,(fd_set *)0x0,(timeval *)0x0);
    if (iVar2 == 0) {
      pcVar8 = "Couldn\'t select the socket.\n";
LAB_00103e25:
      yprintf(OUTPUT_LV_ERROR,pcVar8);
      return -1;
    }
    iVar3 = ipcmd->tcp_type;
    __fd = ipcmd->socket;
    uVar6 = __fd + 0x3f;
    if (-1 < (int)__fd) {
      uVar6 = __fd;
    }
    if (((ulong)local_b8.fds_bits[(int)uVar6 >> 6] >> ((ulong)__fd & 0x3f) & 1) == 0) {
      if (iVar3 != IPCMD_TCP_CLIENT) {
        uVar10 = 0;
        break;
      }
LAB_00103e53:
      uVar7 = 0x40;
      uVar10 = 0;
      goto LAB_00103e5b;
    }
    if (iVar3 == IPCMD_TCP_CLIENT) goto LAB_00103e53;
    local_cc = 0x10;
    iVar2 = accept(__fd,(sockaddr *)local_c8,&local_cc);
    if (iVar2 < 1) {
      pcVar8 = "Invalid socket.\n";
      goto LAB_00103e25;
    }
    uVar10 = 0;
    while (ipcmd->clients[uVar10] != -1) {
      uVar10 = uVar10 + 1;
      if (uVar10 == 0x40) {
        pcVar8 = "Too many connection requests.\n";
        goto LAB_00103e25;
      }
    }
    ipcmd->clients[uVar10] = iVar2;
    pcVar8 = inet_ntoa((in_addr)local_c8._4_4_);
    yprintf(OUTPUT_LV_INFO,"Connection %d accepted from %s.\n",uVar10 & 0xffffffff,pcVar8);
  } while( true );
LAB_00103e8b:
  __fd = ipcmd->clients[uVar10];
  uVar6 = __fd + 0x3f;
  if (-1 < (int)__fd) {
    uVar6 = __fd;
  }
  if (((ulong)local_b8.fds_bits[(int)uVar6 >> 6] >> ((ulong)__fd & 0x3f) & 1) != 0) {
    uVar7 = uVar10 & 0xffffffff;
LAB_00103e5b:
    sVar5 = recv(__fd,data,0x38,0);
    data->pid = uVar10;
    if (0 < (int)sVar5) {
      return 0x38;
    }
    iVar3 = ipcmd->tcp_type;
    goto LAB_00103eb7;
  }
  uVar10 = uVar10 + 1;
  if (uVar10 == 0x40) {
    uVar7 = 0x40;
LAB_00103eb7:
    if (iVar3 == IPCMD_TCP_CLIENT) {
      yprintf(OUTPUT_LV_INFO,"Connection closed.\n");
      ipcmd->connection_error = 1;
      shutdown(ipcmd->socket,2);
      return -1;
    }
    yprintf(OUTPUT_LV_INFO,"Connection %d closed.\n",uVar7);
    ipcmd->clients[(int)uVar7] = -1;
    return 0x38;
  }
  goto LAB_00103e8b;
}

Assistant:

int ipcmd_recv_tcp(struct ipcmd_t* ipcmd, YPSpur_msg* data)
{
  fd_set fds;
  struct sockaddr_in client;
  int sock;
  int i;
  size_t len = sizeof(YPSpur_msg);

  if (ipcmd == NULL || ipcmd->connection_error)
    return -1;

  do
  {
    int recved;
    while (1)
    {
      SIZE_TYPE addr_size;
      int nfds = 0;

      FD_ZERO(&fds);
      FD_SET(ipcmd->socket, &fds);
      if (nfds < ipcmd->socket)
        nfds = ipcmd->socket;
      for (i = 0; i < YPSPUR_MAX_SOCKET; i++)
      {
        if (ipcmd->clients[i] != -1)
        {
          FD_SET(ipcmd->clients[i], &fds);
          if (nfds < ipcmd->clients[i])
            nfds = ipcmd->clients[i];
        }
      }

      nfds++;
      if (!select(nfds, &fds, NULL, NULL, NULL))
      {
        yprintf(OUTPUT_LV_ERROR, "Couldn't select the socket.\n");
        return -1;
      }
      if (!FD_ISSET(ipcmd->socket, &fds))
      {
        break;
      }
      if (ipcmd->tcp_type == IPCMD_TCP_CLIENT)
      {
        break;
      }

      addr_size = sizeof(client);
      sock = accept(ipcmd->socket, (struct sockaddr*)&client, &addr_size);
      if (sock <= 0)
      {
        yprintf(OUTPUT_LV_ERROR, "Invalid socket.\n");
        return -1;
      }
      for (i = 0; i < YPSPUR_MAX_SOCKET; i++)
      {
        if (ipcmd->clients[i] == -1)
        {
          break;
        }
      }
      if (i == YPSPUR_MAX_SOCKET)
      {
        yprintf(OUTPUT_LV_ERROR, "Too many connection requests.\n");
        return -1;
      }
      ipcmd->clients[i] = sock;
      yprintf(OUTPUT_LV_INFO, "Connection %d accepted from %s.\n", i, inet_ntoa(client.sin_addr));
    }

    recved = -1;
    if (ipcmd->tcp_type == IPCMD_TCP_CLIENT)
    {
      recved = recv(ipcmd->socket, (SOCK_DATATYPE)data, len, 0);
      data->pid = 0;
    }
    else
    {
      for (i = 0; i < YPSPUR_MAX_SOCKET; i++)
      {
        if (FD_ISSET(ipcmd->clients[i], &fds))
        {
          recved = recv(ipcmd->clients[i], (SOCK_DATATYPE)data, len, 0);
          data->pid = i;
          break;
        }
      }
    }
    if (recved <= 0)
    {
      if (ipcmd->tcp_type == IPCMD_TCP_CLIENT)
      {
        yprintf(OUTPUT_LV_INFO, "Connection closed.\n");
        ipcmd->connection_error = 1;
        shutdown(ipcmd->socket, SOCK_SHUTDOWN_OPTION);
        return -1;
      }
      yprintf(OUTPUT_LV_INFO, "Connection %d closed.\n", i);
      ipcmd->clients[i] = -1;
      continue;
    }
  }
  while (0);
  return len;
}